

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Type dg::vr::Relations::getNonStrict(Type type)

{
  undefined4 in_EDI;
  Type local_4;
  
  switch(in_EDI) {
  case 3:
    local_4 = SLE;
    break;
  default:
    abort();
  case 5:
    local_4 = ULE;
    break;
  case 7:
    local_4 = SGE;
    break;
  case 9:
    local_4 = UGE;
  }
  return local_4;
}

Assistant:

Relations::Type Relations::getNonStrict(Type type) {
    switch (type) {
    case Relations::SLT:
        return Relations::SLE;
    case Relations::ULT:
        return Relations::ULE;
    case Relations::SGT:
        return Relations::SGE;
    case Relations::UGT:
        return Relations::UGE;
    default:
        assert(0 && "no nonstrict variant");
        abort();
    }
}